

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

void makeTllTable(void)

{
  int iVar1;
  int local_1c;
  int local_18;
  int32_t KL;
  int32_t TL;
  int32_t block;
  int32_t fnum;
  int32_t tmp;
  
  for (TL = 0; TL < 0x10; TL = TL + 1) {
    for (KL = 0; KL < 8; KL = KL + 1) {
      for (local_18 = 0; local_18 < 0x40; local_18 = local_18 + 1) {
        for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
          if (local_1c == 0) {
            tll_table[KL << 4 | TL][local_18][0] = local_18 << 1;
          }
          else {
            iVar1 = (int)((double)(7 - KL) * -6.0 + kl_table[TL]);
            if (iVar1 < 1) {
              tll_table[KL << 4 | TL][local_18][local_1c] = local_18 << 1;
            }
            else {
              tll_table[KL << 4 | TL][local_18][local_1c] =
                   (int)(long)((double)(iVar1 >> (3U - (char)local_1c & 0x1f)) / 0.375) +
                   local_18 * 2;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void makeTllTable(void) {

  int32_t tmp;
  int32_t fnum, block, TL, KL;

  for (fnum = 0; fnum < 16; fnum++) {
    for (block = 0; block < 8; block++) {
      for (TL = 0; TL < 64; TL++) {
        for (KL = 0; KL < 4; KL++) {
          if (KL == 0) {
            tll_table[(block << 4) | fnum][TL][KL] = TL2EG(TL);
          } else {
            tmp = (int32_t)(kl_table[fnum] - dB2(3.000) * (7 - block));
            if (tmp <= 0)
              tll_table[(block << 4) | fnum][TL][KL] = TL2EG(TL);
            else
              tll_table[(block << 4) | fnum][TL][KL] = (uint32_t)((tmp >> (3 - KL)) / EG_STEP) + TL2EG(TL);
          }
        }
      }
    }
  }
}